

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLAttribute * __thiscall tinyxml2::XMLElement::FindAttribute(XMLElement *this,char *name)

{
  bool bVar1;
  char *p;
  XMLAttribute *local_28;
  XMLAttribute *a;
  char *name_local;
  XMLElement *this_local;
  
  local_28 = this->_rootAttribute;
  while( true ) {
    if (local_28 == (XMLAttribute *)0x0) {
      return (XMLAttribute *)0x0;
    }
    p = XMLAttribute::Name(local_28);
    bVar1 = XMLUtil::StringEqual(p,name,0x7fffffff);
    if (bVar1) break;
    local_28 = local_28->_next;
  }
  return local_28;
}

Assistant:

const XMLAttribute* XMLElement::FindAttribute( const char* name ) const
{
    for( XMLAttribute* a = _rootAttribute; a; a = a->_next ) {
        if ( XMLUtil::StringEqual( a->Name(), name ) ) {
            return a;
        }
    }
    return 0;
}